

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.c
# Opt level: O1

void on_pull(rxc_source_logic *self,long n)

{
  return;
}

Assistant:

static void on_pull(struct rxc_source_logic *logic, long n)
{
    struct rxc_source_logic_count *self = (struct rxc_source_logic_count *) logic;
    struct rxc_source_count *source = (struct rxc_source_count *) logic->source;

    for (; n > 0; n--) {
        if (self->count >= source->to) {
            rxc_outlet_complete(logic->out);
            return;
        }

        long *element = malloc(sizeof(long));
        *element = self->count++;

        rxc_outlet_emit(logic->out, element);
    }
}